

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-timesamples-array.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseTimeSamplesOfArray
          (AsciiParser *this,string *type_name,TimeSamples *ts_out)

{
  bool bVar1;
  char local_a9;
  uint64_t uStack_a8;
  char nc;
  uint64_t loc;
  undefined1 local_98 [7];
  char sep;
  Value value;
  string local_78;
  double local_58;
  double timeVal;
  undefined1 local_48 [3];
  char c;
  TimeSamples ts;
  TimeSamples *ts_out_local;
  string *type_name_local;
  AsciiParser *this_local;
  
  ts._24_8_ = ts_out;
  tinyusdz::value::TimeSamples::TimeSamples((TimeSamples *)local_48);
  bVar1 = Expect(this,'{');
  if (bVar1) {
    bVar1 = SkipWhitespaceAndNewline(this,true);
    if (bVar1) {
      do {
        bVar1 = Eof(this);
        if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_006a33a7;
        bVar1 = Char1(this,(char *)((long)&timeVal + 3));
        if (!bVar1) {
          this_local._7_1_ = 0;
          timeVal._4_4_ = 1;
          goto LAB_006a33c6;
        }
        if (timeVal._3_1_ == '}') goto LAB_006a33a7;
        Rewind(this,1);
        bVar1 = ReadBasicType(this,&local_58);
        if (!bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_78,"Parse time value failed.",
                     (allocator *)((long)&value.v_.vtable + 7));
          PushError(this,&local_78);
          ::std::__cxx11::string::~string((string *)&local_78);
          ::std::allocator<char>::~allocator((allocator<char> *)((long)&value.v_.vtable + 7));
          this_local._7_1_ = 0;
          timeVal._4_4_ = 1;
          goto LAB_006a33c6;
        }
        bVar1 = SkipWhitespace(this);
        if (!bVar1) {
          this_local._7_1_ = 0;
          timeVal._4_4_ = 1;
          goto LAB_006a33c6;
        }
        bVar1 = Expect(this,':');
        if (!bVar1) {
          this_local._7_1_ = 0;
          timeVal._4_4_ = 1;
          goto LAB_006a33c6;
        }
        bVar1 = SkipWhitespace(this);
        if (!bVar1) {
          this_local._7_1_ = 0;
          timeVal._4_4_ = 1;
          goto LAB_006a33c6;
        }
        tinyusdz::value::Value::Value((Value *)local_98);
        bVar1 = ParseTimeSampleValueOfArrayType(this,type_name,(Value *)local_98);
        if (bVar1) {
          bVar1 = SkipWhitespace(this);
          if (bVar1) {
            loc._7_1_ = '\0';
            bVar1 = Char1(this,(char *)((long)&loc + 7));
            if (bVar1) {
              if (loc._7_1_ == '}') {
                tinyusdz::value::TimeSamples::add_sample
                          ((TimeSamples *)local_48,local_58,(Value *)local_98);
                timeVal._4_4_ = 3;
              }
              else {
                if (loc._7_1_ != ',') {
                  Rewind(this,1);
                  uStack_a8 = CurrLoc(this);
                  bVar1 = SkipWhitespaceAndNewline(this,true);
                  if (bVar1) {
                    bVar1 = Char1(this,&local_a9);
                    if (bVar1) {
                      if (local_a9 != '}') goto LAB_006a3327;
                      tinyusdz::value::TimeSamples::add_sample
                                ((TimeSamples *)local_48,local_58,(Value *)local_98);
                      timeVal._4_4_ = 3;
                    }
                    else {
                      this_local._7_1_ = 0;
                      timeVal._4_4_ = 1;
                    }
                    goto LAB_006a337a;
                  }
LAB_006a3327:
                  SeekTo(this,uStack_a8);
                }
                bVar1 = SkipWhitespaceAndNewline(this,true);
                if (bVar1) {
                  tinyusdz::value::TimeSamples::add_sample
                            ((TimeSamples *)local_48,local_58,(Value *)local_98);
                  timeVal._4_4_ = 0;
                }
                else {
                  this_local._7_1_ = 0;
                  timeVal._4_4_ = 1;
                }
              }
            }
            else {
              this_local._7_1_ = 0;
              timeVal._4_4_ = 1;
            }
          }
          else {
            this_local._7_1_ = 0;
            timeVal._4_4_ = 1;
          }
        }
        else {
          this_local._7_1_ = 0;
          timeVal._4_4_ = 1;
        }
LAB_006a337a:
        tinyusdz::value::Value::~Value((Value *)local_98);
      } while (timeVal._4_4_ == 0);
      if (timeVal._4_4_ == 3) {
LAB_006a33a7:
        if (ts._24_8_ != 0) {
          tinyusdz::value::TimeSamples::operator=((TimeSamples *)ts._24_8_,(TimeSamples *)local_48);
        }
        this_local._7_1_ = 1;
        timeVal._4_4_ = 1;
      }
    }
    else {
      this_local._7_1_ = 0;
      timeVal._4_4_ = 1;
    }
  }
  else {
    this_local._7_1_ = 0;
    timeVal._4_4_ = 1;
  }
LAB_006a33c6:
  tinyusdz::value::TimeSamples::~TimeSamples((TimeSamples *)local_48);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ParseTimeSamplesOfArray(const std::string &type_name,
                                   value::TimeSamples *ts_out) {

  value::TimeSamples ts;

  if (!Expect('{')) {
    return false;
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == '}') {
      break;
    }

    Rewind(1);

    double timeVal;
    // -inf, inf and nan are handled.
    if (!ReadBasicType(&timeVal)) {
      PushError("Parse time value failed.");
      return false;
    }

    if (!SkipWhitespace()) {
      return false;
    }

    if (!Expect(':')) {
      return false;
    }

    if (!SkipWhitespace()) {
      return false;
    }

    value::Value value;
    if (!ParseTimeSampleValueOfArrayType(type_name, &value)) { // could be None(ValueBlock)
      return false;
    }

    // The last element may have separator ','
    {
      // Semicolon ';' is not allowed as a separator for timeSamples array
      // values.
      if (!SkipWhitespace()) {
        return false;
      }

      char sep{};
      if (!Char1(&sep)) {
        return false;
      }

      DCOUT("sep = " << sep);
      if (sep == '}') {
        // End of item
        ts.add_sample(timeVal, value);
        break;
      } else if (sep == ',') {
        // ok
      } else {
        Rewind(1);

        // Look ahead Newline + '}'
        auto loc = CurrLoc();

        if (SkipWhitespaceAndNewline()) {
          char nc;
          if (!Char1(&nc)) {
            return false;
          }

          if (nc == '}') {
            // End of item
            ts.add_sample(timeVal, value);
            break;
          }
        }

        // Rewind and continue parsing.
        SeekTo(loc);
      }
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    ts.add_sample(timeVal, value);
  }

  DCOUT("Parse TimeSamples success. # of items = " << ts.size());

  if (ts_out) {
    (*ts_out) = std::move(ts);
  }

  return true;
}